

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

void gdImageString(gdImagePtr im,gdFontPtr f,int x,int y,uchar *s,int color)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  
  sVar1 = strlen((char *)s);
  uVar3 = 0;
  uVar2 = sVar1 & 0xffffffff;
  if ((int)sVar1 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    gdImageChar(im,f,x,y,(uint)s[uVar3],color);
    x = x + f->w;
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageString (gdImagePtr im, gdFontPtr f,
								 int x, int y, unsigned char *s, int color)
{
	int i;
	int l;
	l = strlen ((char *) s);
	for (i = 0; (i < l); i++) {
		gdImageChar (im, f, x, y, s[i], color);
		x += f->w;
	}
}